

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

TempGuestArenaAllocatorObject * __thiscall
ThreadContext::GetTemporaryGuestAllocator(ThreadContext *this,LPCWSTR name)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableData *pRVar5;
  TempArenaAllocatorWrapper<true> **ppTVar6;
  nullptr_t local_30;
  ThreadContext *local_28;
  TempGuestArenaAllocatorObject *allocator;
  LPCWSTR name_local;
  ThreadContext *this_local;
  
  allocator = (TempGuestArenaAllocatorObject *)name;
  name_local = (LPCWSTR)this;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x922,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->temporaryGuestArenaAllocatorCount == 0) {
    this_local = (ThreadContext *)Js::TempArenaAllocatorWrapper<true>::Create(this);
  }
  else {
    this->temporaryGuestArenaAllocatorCount = this->temporaryGuestArenaAllocatorCount - 1;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    ppTVar6 = Memory::WriteBarrierPtr::operator_cast_to_TempArenaAllocatorWrapper__
                        ((WriteBarrierPtr *)
                         (pRVar5->temporaryGuestArenaAllocators +
                         this->temporaryGuestArenaAllocatorCount));
    local_28 = (ThreadContext *)*ppTVar6;
    Js::TempArenaAllocatorWrapper<true>::AdviseInUse((TempArenaAllocatorWrapper<true> *)local_28);
    local_30 = (nullptr_t)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::TempArenaAllocatorWrapper<true>_>::operator=
              (pRVar5->temporaryGuestArenaAllocators + this->temporaryGuestArenaAllocatorCount,
               &local_30);
    this_local = local_28;
  }
  return (TempGuestArenaAllocatorObject *)this_local;
}

Assistant:

Js::TempGuestArenaAllocatorObject *
ThreadContext::GetTemporaryGuestAllocator(LPCWSTR name)
{
    AssertCanHandleOutOfMemory();

    if (temporaryGuestArenaAllocatorCount != 0)
    {
        temporaryGuestArenaAllocatorCount--;
        Js::TempGuestArenaAllocatorObject * allocator = recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount];
        allocator->AdviseInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = nullptr;
        return allocator;
    }

    return Js::TempGuestArenaAllocatorObject::Create(this);
}